

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

bool __thiscall chrono::ChBody::TrySleeping(ChBody *this)

{
  byte *pbVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar2 = this->bflags;
  this->bflags = uVar2 & 0xffffefff;
  if ((uVar2 >> 10 & 1) == 0) {
    return false;
  }
  iVar4 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
    auVar6 = vandpd_avx(auVar5,*(undefined1 (*) [16])
                                (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.
                                m_data);
    auVar7 = vandpd_avx(auVar7,auVar5);
    auVar3 = vshufps_avx(auVar6,auVar6,0x4e);
    auVar6 = vmaxsd_avx(auVar3,auVar6);
    auVar6 = vmaxsd_avx(auVar7,auVar6);
    if (auVar6._0_8_ < (double)this->sleep_minspeed) {
      auVar6 = vandpd_avx(auVar5,*(undefined1 (*) [16])
                                  (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot
                                  .m_data);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
      auVar7 = vshufps_avx(auVar6,auVar6,0x4e);
      auVar3 = vmaxsd_avx(auVar7,auVar6);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
      auVar6 = vandpd_avx(auVar6,auVar5);
      auVar7 = vandpd_avx(auVar8,auVar5);
      auVar6 = vmaxsd_avx(auVar6,auVar3);
      auVar6 = vmaxsd_avx(auVar7,auVar6);
      if (auVar6._0_8_ + auVar6._0_8_ < (double)this->sleep_minwvel) {
        if ((this->super_ChPhysicsItem).super_ChObj.ChTime - (double)this->sleep_starttime <=
            (double)this->sleep_time) {
          return false;
        }
        pbVar1 = (byte *)((long)&this->bflags + 1);
        *pbVar1 = *pbVar1 | 0x10;
        return true;
      }
    }
    this->sleep_starttime = (float)(this->super_ChPhysicsItem).super_ChObj.ChTime;
  }
  return false;
}

Assistant:

void ChBody::BFlagSet(BodyFlag mask, bool state) {
    if (state)
        bflags |= mask;
    else
        bflags &= ~mask;
}